

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

void __thiscall Layout::dump(Layout *this)

{
  LayoutItem *pLVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  ostream *poVar4;
  LayoutItem *c;
  
  pLVar1 = this->m_firstCorner;
  if (pLVar1 != (LayoutItem *)0x0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(pLVar1->m_instance)._M_dataplus._M_p,
                        (pLVar1->m_instance)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(pLVar1->m_cellname)._M_dataplus._M_p,
                        (pLVar1->m_cellname)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::ostream::_M_insert<double>((&pLVar1->m_x)[this->m_dir != DIR_HORIZONTAL]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  for (p_Var2 = (this->m_items).super__List_base<LayoutItem_*,_std::allocator<LayoutItem_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->m_items; p_Var2 = p_Var2->_M_next) {
    p_Var3 = p_Var2[1]._M_next;
    if (*(uint *)((long)(p_Var3 + 8) + 0xc) < 2) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)p_Var3[1]._M_next,
                          (long)*(_List_node_base **)((long)(p_Var3 + 1) + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)p_Var3[3]._M_next,
                          (long)*(_List_node_base **)((long)(p_Var3 + 3) + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::ostream::_M_insert<double>
                         ((double)*(_List_node_base **)
                                   ((long)(p_Var3 + 7) + 8U +
                                   (ulong)(this->m_dir != DIR_HORIZONTAL) * 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
  }
  pLVar1 = this->m_lastCorner;
  if (pLVar1 != (LayoutItem *)0x0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(pLVar1->m_instance)._M_dataplus._M_p,
                        (pLVar1->m_instance)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(pLVar1->m_cellname)._M_dataplus._M_p,
                        (pLVar1->m_cellname)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::ostream::_M_insert<double>((&pLVar1->m_x)[this->m_dir != DIR_HORIZONTAL]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    return;
  }
  return;
}

Assistant:

void Layout::dump()
{
    if (m_firstCorner != nullptr)
    {
        auto c = m_firstCorner;
        std::cout << c->m_instance << " : " << c->m_cellname << " " << getItemPos(c) << "\n";
    }

    for(auto c : m_items)
    {
        if ((c->m_ltype == LayoutItem::TYPE_CELL) || (c->m_ltype == LayoutItem::TYPE_CORNER))
        {
            std::cout << c->m_instance << " : " << c->m_cellname << " " << getItemPos(c) << "\n";
        }
    }

    if (m_lastCorner != nullptr)
    {
        auto c = m_lastCorner;
        std::cout << c->m_instance << " : " << c->m_cellname << " " << getItemPos(c) << "\n";
    }

}